

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O1

void __thiscall
TApp_IncorrectConstructionFlagPositional3_Test::TestBody
          (TApp_IncorrectConstructionFlagPositional3_Test *this)

{
  bool bVar1;
  bool x;
  bool local_71;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  string local_60;
  string local_40;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cat","");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
    CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
              (&(this->super_TApp).app,&local_40,&local_71,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_70);
  testing::internal::AssertHelper::AssertHelper
            (&local_68,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x7b,
             "Expected: app.add_flag(\"cat\", x) throws an exception of type CLI::IncorrectConstruction.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if (((local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_70.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_70.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(TApp, IncorrectConstructionFlagPositional3) {
    bool x;
    EXPECT_THROW(app.add_flag("cat", x), CLI::IncorrectConstruction);
}